

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

FILE * __thiscall fmt::v5::file::fdopen(file *this,int __fd,char *__modes)

{
  FILE *f_00;
  char *s;
  int *piVar1;
  undefined4 in_register_00000034;
  system_error *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  FILE *f;
  buffered_file *bf;
  undefined4 in_stack_ffffffffffffffa0;
  FILE *pFVar2;
  file *pfVar3;
  int error_code;
  
  pFVar2 = (FILE *)this;
  pfVar3 = this;
  f_00 = test::fdopen(*(int *)CONCAT44(in_register_00000034,__fd),__modes);
  error_code = (int)((ulong)pfVar3 >> 0x20);
  if (f_00 != (FILE *)0x0) {
    buffered_file::buffered_file((buffered_file *)this,(FILE *)f_00);
    *(int *)CONCAT44(in_register_00000034,__fd) = -1;
    return pFVar2;
  }
  s = (char *)__cxa_allocate_exception(0x18);
  piVar1 = __errno_location();
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)CONCAT44(*piVar1,in_stack_ffffffffffffffa0),s);
  system_error::system_error<>(unaff_retaddr,error_code,(string_view)in_stack_00000008);
  __cxa_throw(s,&system_error::typeinfo,system_error::~system_error);
}

Assistant:

buffered_file file::fdopen(const char *mode) {
  // Don't retry as fdopen doesn't return EINTR.
  FILE *f = FMT_POSIX_CALL(fdopen(fd_, mode));
  if (!f)
    FMT_THROW(system_error(errno,
                           "cannot associate stream with file descriptor"));
  buffered_file bf(f);
  fd_ = -1;
  return bf;
}